

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetFactor_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  bool bVar1;
  FactorType FVar2;
  AssertionResult gtest_ar;
  FactorType newFactor;
  ParticleType particle;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  double *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  Type type;
  AssertHelper *in_stack_ffffffffffffffa0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_ffffffffffffffb0;
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (in_stack_ffffffffffffffb0);
  pica::Particle<(pica::Dimension)2>::setFactor
            ((Particle<(pica::Dimension)2> *)&stack0xffffffffffffffb8,6523.54);
  FVar2 = pica::Particle<(pica::Dimension)2>::getFactor
                    ((Particle<(pica::Dimension)2> *)&stack0xffffffffffffffb8);
  type = (Type)((ulong)FVar2 >> 0x20);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (double *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    testing::AssertionResult::failure_message((AssertionResult *)0x205cbc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,type,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    testing::Message::~Message((Message *)0x205d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x205d68);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetFactor) 
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    ParticleType particle = this->randomParticle();
    FactorType newFactor = 6523.54;
    particle.setFactor(newFactor);
    ASSERT_EQ(newFactor, particle.getFactor());
}